

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O0

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<double,float>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          float *out_value)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  long in_RCX;
  byte in_DL;
  GeometryAttribute *in_RDI;
  int i_1;
  double in_value;
  int i;
  uint8_t *src_address;
  undefined4 in_stack_ffffffffffffffc0;
  AttributeValueIndex in_stack_ffffffffffffffc4;
  double local_38;
  int local_30;
  double *local_28;
  long local_20;
  byte local_11 [17];
  
  local_20 = in_RCX;
  local_11[0] = in_DL;
  local_28 = (double *)GetAddress(in_RDI,in_stack_ffffffffffffffc4);
  local_30 = 0;
  while( true ) {
    iVar1 = local_30;
    pbVar4 = std::min<unsigned_char>(&in_RDI->num_components_,local_11);
    if ((int)(uint)*pbVar4 <= iVar1) {
      for (uVar3 = (uint)in_RDI->num_components_; (int)uVar3 < (int)(uint)local_11[0];
          uVar3 = uVar3 + 1) {
        *(undefined4 *)(local_20 + (long)(int)uVar3 * 4) = 0;
      }
      return true;
    }
    bVar2 = IsAddressValid((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffc4.value_,in_stack_ffffffffffffffc0),
                           (uint8_t *)in_RDI);
    if (!bVar2) break;
    local_38 = *local_28;
    bVar2 = ConvertComponentValue<double,float>
                      (&local_38,(bool)(in_RDI->normalized_ & 1),
                       (float *)(local_20 + (long)local_30 * 4));
    if (!bVar2) {
      return false;
    }
    local_28 = local_28 + 1;
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }